

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::FieldNameCapitalized_abi_cxx11_
                   (FieldDescriptor *field)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  string *in_RDI;
  string *result;
  FieldDescriptor *in_stack_000000a8;
  
  FieldName_abi_cxx11_(in_stack_000000a8);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::operator[]((ulong)in_RDI);
    cVar1 = ascii_toupper('\0');
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pcVar3 = cVar1;
  }
  return in_RDI;
}

Assistant:

string FieldNameCapitalized(const FieldDescriptor* field) {
  // Want the same suffix handling, so upcase the first letter of the other
  // name.
  string result = FieldName(field);
  if (result.length() > 0) {
    result[0] = ascii_toupper(result[0]);
  }
  return result;
}